

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# syntax_tests.cpp
# Opt level: O2

void __thiscall
test::syntax_tests::iu_PrintToTest_x_iutest_x_Iomanip_Test::Body
          (iu_PrintToTest_x_iutest_x_Iomanip_Test *this)

{
  iuCodeMessage local_1c0;
  undefined1 local_190 [392];
  
  memset((iu_global_format_stringstream *)local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_190);
  std::endl<char,std::char_traits<char>>((ostream *)(local_190 + 0x10));
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x400,"Succeeded.\n");
  local_1c0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,(Fixed *)local_190);
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_190);
  memset((iu_global_format_stringstream *)local_190,0,0x188);
  iutest::iu_global_format_stringstream::iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_190);
  std::ends<char,std::char_traits<char>>((ostream *)(local_190 + 0x10));
  iutest::detail::iuCodeMessage::iuCodeMessage
            (&local_1c0,
             "/workspace/llm4binary/github/license_c_cmakelists/srz-zumix[P]iutest/test/syntax_tests.cpp"
             ,0x401,"Succeeded.\n");
  local_1c0._44_4_ = 0;
  iutest::AssertionHelper::operator=((AssertionHelper *)&local_1c0,(Fixed *)local_190);
  std::__cxx11::string::~string((string *)&local_1c0);
  iutest::iu_global_format_stringstream::~iu_global_format_stringstream
            ((iu_global_format_stringstream *)local_190);
  return;
}

Assistant:

IUTEST(PrintToTest, Iomanip)
{
    IUTEST_SUCCEED() << ::std::endl;
    IUTEST_SUCCEED() << ::std::ends;
}